

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  bool bVar1;
  ValueType VVar2;
  ValueType VVar3;
  int iVar4;
  uint *puVar5;
  size_type sVar6;
  size_type sVar7;
  size_type otherSize;
  size_type thisSize;
  int comp;
  allocator<char> local_69;
  String local_68;
  uint local_44;
  char *pcStack_40;
  uint min_len;
  char *other_str;
  char *this_str;
  uint local_28;
  uint other_len;
  uint this_len;
  int typeDelta;
  Value *other_local;
  Value *this_local;
  
  _this_len = other;
  other_local = this;
  VVar2 = type(this);
  VVar3 = type(_this_len);
  other_len = VVar2 - VVar3;
  if (other_len == 0) {
    VVar2 = type(this);
    switch(VVar2) {
    case nullValue:
      this_local._7_1_ = false;
      break;
    case intValue:
      this_local._7_1_ = (this->value_).int_ < (_this_len->value_).int_;
      break;
    case uintValue:
      this_local._7_1_ = (this->value_).uint_ < (_this_len->value_).uint_;
      break;
    case realValue:
      this_local._7_1_ = (this->value_).real_ < (_this_len->value_).real_;
      break;
    case stringValue:
      if (((this->value_).int_ == 0) || ((_this_len->value_).int_ == 0)) {
        this_local._7_1_ = (_this_len->value_).int_ != 0;
      }
      else {
        bVar1 = isAllocated(this);
        decodePrefixedString(bVar1,(this->value_).string_,&local_28,&other_str);
        bVar1 = isAllocated(_this_len);
        decodePrefixedString
                  (bVar1,(_this_len->value_).string_,(uint *)((long)&this_str + 4),
                   &stack0xffffffffffffffc0);
        puVar5 = std::min<unsigned_int>(&local_28,(uint *)((long)&this_str + 4));
        local_44 = *puVar5;
        if ((other_str == (char *)0x0) || (pcStack_40 == (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"assert json failed",&local_69);
          throwLogicError(&local_68);
        }
        iVar4 = memcmp(other_str,pcStack_40,(ulong)local_44);
        if (iVar4 < 0) {
          this_local._7_1_ = true;
        }
        else if (iVar4 < 1) {
          this_local._7_1_ = local_28 < this_str._4_4_;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case booleanValue:
      this_local._7_1_ = ((this->value_).bool_ & 1U) < ((_this_len->value_).bool_ & 1U);
      break;
    case arrayValue:
    case objectValue:
      sVar6 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      sVar7 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((_this_len->value_).map_);
      if (sVar6 == sVar7) {
        this_local._7_1_ = std::operator<((this->value_).map_,(_this_len->value_).map_);
      }
      else {
        this_local._7_1_ = sVar6 < sVar7;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x217,"bool Json::Value::operator<(const Value &) const");
    }
  }
  else {
    this_local._7_1_ = (int)other_len < 0;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type() - other.type();
  if (typeDelta)
    return typeDelta < 0;
  switch (type()) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue: {
    if ((value_.string_ == nullptr) || (other.value_.string_ == nullptr)) {
      return other.value_.string_ != nullptr;
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->isAllocated(), this->value_.string_, &this_len,
                         &this_str);
    decodePrefixedString(other.isAllocated(), other.value_.string_, &other_len,
                         &other_str);
    unsigned min_len = std::min<unsigned>(this_len, other_len);
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, min_len);
    if (comp < 0)
      return true;
    if (comp > 0)
      return false;
    return (this_len < other_len);
  }
  case arrayValue:
  case objectValue: {
    auto thisSize = value_.map_->size();
    auto otherSize = other.value_.map_->size();
    if (thisSize != otherSize)
      return thisSize < otherSize;
    return (*value_.map_) < (*other.value_.map_);
  }
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}